

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O2

int next_proto_cb(SSL *param_1,uchar **out,uchar *outlen,uchar *in,uint inlen,void *arg)

{
  int iVar1;
  QLoggingCategory *pQVar2;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = q_SSL_select_next_proto(out,outlen,in,inlen,*arg,(uint)*(ushort *)((long)arg + 8));
  if (iVar1 == 2) {
    *(undefined4 *)((long)arg + 0xc) = 2;
  }
  else if (iVar1 == 1) {
    *(undefined4 *)((long)arg + 0xc) = 1;
  }
  else if (iVar1 == 0) {
    *(undefined4 *)((long)arg + 0xc) = 0;
  }
  else {
    pQVar2 = lcTlsBackend();
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_18 = pQVar2->name;
      local_30[0] = '\x02';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[7] = '\0';
      local_30[8] = '\0';
      local_30[9] = '\0';
      local_30[10] = '\0';
      local_30[0xb] = '\0';
      local_30[0xc] = '\0';
      local_30[0xd] = '\0';
      local_30[0xe] = '\0';
      local_30[0xf] = '\0';
      local_30[0x10] = '\0';
      local_30[0x11] = '\0';
      local_30[0x12] = '\0';
      local_30[0x13] = '\0';
      local_30[0x14] = '\0';
      local_30[0x15] = '\0';
      local_30[0x16] = '\0';
      local_30[0x17] = '\0';
      QMessageLogger::warning(local_30,"OpenSSL sent unknown NPN status");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int next_proto_cb(SSL *, unsigned char **out, unsigned char *outlen,
                         const unsigned char *in, unsigned int inlen, void *arg)
{
    QSslContext::NPNContext *ctx = reinterpret_cast<QSslContext::NPNContext *>(arg);

    // comment out to debug:
//    QList<QByteArray> supportedVersions;
//    for (unsigned int i = 0; i < inlen; ) {
//        QByteArray version(reinterpret_cast<const char *>(&in[i+1]), in[i]);
//        supportedVersions << version;
//        i += in[i] + 1;
//    }

    int proto = q_SSL_select_next_proto(out, outlen, in, inlen, ctx->data, ctx->len);
    switch (proto) {
    case OPENSSL_NPN_UNSUPPORTED:
        ctx->status = QSslConfiguration::NextProtocolNegotiationNone;
        break;
    case OPENSSL_NPN_NEGOTIATED:
        ctx->status = QSslConfiguration::NextProtocolNegotiationNegotiated;
        break;
    case OPENSSL_NPN_NO_OVERLAP:
        ctx->status = QSslConfiguration::NextProtocolNegotiationUnsupported;
        break;
    default:
        qCWarning(lcTlsBackend, "OpenSSL sent unknown NPN status");
    }

    return SSL_TLSEXT_ERR_OK;
}